

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O0

bool __thiscall google::protobuf::FieldDescriptor::is_repeated(FieldDescriptor *this)

{
  bool *v1;
  bool *v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_30;
  Voidify local_1b;
  bool local_1a;
  bool local_19;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *this_local;
  
  local_19 = (bool)((byte)this->field_0x1 >> 5 & 1);
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_19);
  local_1a = (byte)this->field_0x1 >> 6 == 3;
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_1a);
  local_18 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                       (v1,v2,"is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  if (local_18 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb54,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  return (bool)((byte)this->field_0x1 >> 5 & 1);
}

Assistant:

inline bool FieldDescriptor::is_repeated() const {
  ABSL_DCHECK_EQ(is_repeated_, static_cast<Label>(label_) == LABEL_REPEATED);
  return is_repeated_;
}